

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

int satoko_solve_assumptions(solver_t *s,int *plits,int nlits)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < nlits) {
    uVar2 = 0;
    do {
      satoko_assump_push(s,plits[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)nlits != uVar2);
  }
  iVar1 = satoko_solve(s);
  if (0 < nlits) {
    do {
      satoko_assump_pop(s);
      nlits = nlits + -1;
    } while (nlits != 0);
  }
  return iVar1;
}

Assistant:

int satoko_solve_assumptions(solver_t *s, int * plits, int nlits)
{
    int i, status;
    // printf("\n[Satoko] Solve with assumptions.. (%d)\n", vec_uint_size(s->assumptions));
    // printf("[Satoko]   + Variables: %d\n", satoko_varnum(s));
    // printf("[Satoko]   + Clauses: %d\n", satoko_clausenum(s));
    // printf("[Satoko]   + Trail size: %d\n", vec_uint_size(s->trail));
    // printf("[Satoko]   + Queue head: %d\n", s->i_qhead);
    // solver_debug_check_trail(s);
    for ( i = 0; i < nlits; i++ )
        satoko_assump_push( s, plits[i] );
    status = satoko_solve( s );
    for ( i = 0; i < nlits; i++ )
        satoko_assump_pop( s );
    return status;
}